

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O2

int __thiscall
zmq::socket_base_t::getsockopt
          (socket_base_t *this,int __fd,int __level,int __optname,void *__optval,socklen_t *__optlen
          )

{
  int __errnum;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  char *errmsg_;
  undefined4 in_register_0000000c;
  size_t *optvallen_;
  undefined4 in_register_00000014;
  void *optval_;
  mutex_t *mutex_;
  scoped_optional_lock_t sync_lock;
  
  optval_ = (void *)CONCAT44(in_register_00000014,__level);
  optvallen_ = (size_t *)CONCAT44(in_register_0000000c,__optname);
  mutex_ = (mutex_t *)0x0;
  if (this->_thread_safe != false) {
    mutex_ = &this->_sync;
  }
  scoped_optional_lock_t::scoped_optional_lock_t(&sync_lock,mutex_);
  if (this->_ctx_terminated == false) {
    if (__fd == 0x51) {
      uVar1 = (uint)this->_thread_safe;
    }
    else if (__fd == 0xe) {
      if (this->_thread_safe != false) {
        iVar3 = 0x16;
        goto LAB_001aff81;
      }
      uVar1 = mailbox_t::get_fd((mailbox_t *)this->_mailbox);
    }
    else {
      if (__fd == 0xf) {
        iVar3 = process_commands(this,0,false);
        if (iVar3 != 0) {
          piVar4 = __errno_location();
          __errnum = *piVar4;
          iVar3 = -1;
          if ((__errnum == 4) || (__errnum == 0x9523dfd)) goto LAB_001b0027;
          errmsg_ = strerror(__errnum);
          fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
                  ,0x1e4);
          fflush(_stderr);
          zmq_abort(errmsg_);
        }
        uVar1 = (*(this->super_own_t).super_object_t._vptr_object_t[0x22])(this);
        uVar2 = (*(this->super_own_t).super_object_t._vptr_object_t[0x24])(this);
        iVar3 = do_getsockopt<int>(optval_,optvallen_,(uVar2 & 0xff) + (uVar1 & 0xff) * 2);
        goto LAB_001b0027;
      }
      if (__fd == 0x20) {
        iVar3 = do_getsockopt(optval_,optvallen_,&this->_last_endpoint);
        goto LAB_001b0027;
      }
      if (__fd != 0xd) {
        iVar3 = options_t::getsockopt
                          (&(this->super_own_t).options,__fd,__level,__optname,__optval,__optlen);
        goto LAB_001b0027;
      }
      uVar1 = (uint)this->_rcvmore;
    }
    iVar3 = do_getsockopt<int>(optval_,optvallen_,uVar1);
  }
  else {
    iVar3 = 0x9523dfd;
LAB_001aff81:
    piVar4 = __errno_location();
    *piVar4 = iVar3;
    iVar3 = -1;
  }
LAB_001b0027:
  scoped_optional_lock_t::~scoped_optional_lock_t(&sync_lock);
  return iVar3;
}

Assistant:

int zmq::socket_base_t::getsockopt (int option_,
                                    void *optval_,
                                    size_t *optvallen_)
{
    scoped_optional_lock_t sync_lock (_thread_safe ? &_sync : NULL);

    if (unlikely (_ctx_terminated)) {
        errno = ETERM;
        return -1;
    }

    if (option_ == ZMQ_RCVMORE) {
        return do_getsockopt<int> (optval_, optvallen_, _rcvmore ? 1 : 0);
    }

    if (option_ == ZMQ_FD) {
        if (_thread_safe) {
            // thread safe socket doesn't provide file descriptor
            errno = EINVAL;
            return -1;
        }

        return do_getsockopt<fd_t> (
          optval_, optvallen_,
          (static_cast<mailbox_t *> (_mailbox))->get_fd ());
    }

    if (option_ == ZMQ_EVENTS) {
        const int rc = process_commands (0, false);
        if (rc != 0 && (errno == EINTR || errno == ETERM)) {
            return -1;
        }
        errno_assert (rc == 0);

        return do_getsockopt<int> (optval_, optvallen_,
                                   (has_out () ? ZMQ_POLLOUT : 0)
                                     | (has_in () ? ZMQ_POLLIN : 0));
    }

    if (option_ == ZMQ_LAST_ENDPOINT) {
        return do_getsockopt (optval_, optvallen_, _last_endpoint);
    }

    if (option_ == ZMQ_THREAD_SAFE) {
        return do_getsockopt<int> (optval_, optvallen_, _thread_safe ? 1 : 0);
    }

    return options.getsockopt (option_, optval_, optvallen_);
}